

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getUsedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar2;
  bool bVar3;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  shared_ptr<mocker::nasm::Call> p;
  shared_ptr<mocker::nasm::Mov> p_1;
  shared_ptr<mocker::nasm::Lea> p_2;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<mocker::nasm::IDiv> p_8;
  shared_ptr<mocker::nasm::Inst> local_48;
  shared_ptr<mocker::nasm::Inst> local_38;
  
  std::dynamic_pointer_cast<mocker::nasm::Empty,mocker::nasm::Inst>
            ((shared_ptr<mocker::nasm::Inst> *)&p_2);
  if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::dynamic_pointer_cast<mocker::nasm::Pop,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&p);
    if (p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::nasm::Jmp,mocker::nasm::Inst>
                ((shared_ptr<mocker::nasm::Inst> *)&p_1);
      if (p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::dynamic_pointer_cast<mocker::nasm::Cqo,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&p_8);
        bVar3 = true;
        if (p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::dynamic_pointer_cast<mocker::nasm::CJump,mocker::nasm::Inst>(&local_48);
          bVar3 = true;
          if (local_48.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::dynamic_pointer_cast<mocker::nasm::Set,mocker::nasm::Inst>(&local_38);
            bVar3 = local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_48.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (bVar3) goto LAB_0018e4a2;
        std::dynamic_pointer_cast<mocker::nasm::Call,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&p);
        if (p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          p_Var1 = &rdi()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&p_2,p_Var1
                    );
          p_Var1 = &rsi()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a8,p_Var1);
          p_Var1 = &rdx()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_98,p_Var1);
          p_Var1 = &rcx()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_88,p_Var1);
          p_Var1 = &r8()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_78,p_Var1);
          p_Var1 = &r9()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_68,p_Var1);
          __l._M_len = 6;
          __l._M_array = (iterator)&p_2;
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::vector(__return_storage_ptr__,__l,(allocator_type *)&p_1);
          lVar2 = 0x58;
          do {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar2));
            lVar2 = lVar2 + -0x10;
          } while (lVar2 != -8);
LAB_0018e62a:
          this = &p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          goto LAB_0018e7ae;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&p_1);
        if (p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::dynamic_pointer_cast<mocker::nasm::Lea,mocker::nasm::Inst>
                    ((shared_ptr<mocker::nasm::Inst> *)&p_2);
          if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::UnaryInst,mocker::nasm::Inst>
                      ((shared_ptr<mocker::nasm::Inst> *)&p_2);
            if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>
                        ((shared_ptr<mocker::nasm::Inst> *)&p_1);
              if (p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 *)&p_2,(shared_ptr<mocker::nasm::Addr> *)
                                        &((p_1.
                                           super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->dest).
                                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 *)&p,(shared_ptr<mocker::nasm::Addr> *)
                                      &((p_1.
                                         super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->operand).
                                       super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
                anon_unknown_52::merge
                          (__return_storage_ptr__,
                           (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            *)&p_2,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                    *)&p);
LAB_0018e809:
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)&p);
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)&p_2);
                goto LAB_0018e721;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::dynamic_pointer_cast<mocker::nasm::Push,mocker::nasm::Inst>
                        ((shared_ptr<mocker::nasm::Inst> *)&p_2);
              if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Leave,mocker::nasm::Inst>
                          ((shared_ptr<mocker::nasm::Inst> *)&p_2);
                if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::dynamic_pointer_cast<mocker::nasm::Cmp,mocker::nasm::Inst>
                            ((shared_ptr<mocker::nasm::Inst> *)&p_1);
                  if (p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p_1.
                                super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::dynamic_pointer_cast<mocker::nasm::IDiv,mocker::nasm::Inst>
                              ((shared_ptr<mocker::nasm::Inst> *)&p_8);
                    if (p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      p_Var1 = &rax()->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    *)&p_2,p_Var1);
                      p_Var1 = &rdx()->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ;
                      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr(&local_a8,p_Var1);
                      __l_03._M_len = 2;
                      __l_03._M_array = (iterator)&p_2;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                *)&p,__l_03,(allocator_type *)&local_48);
                      getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       *)&p_1,&(p_8.
                                                super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->rhs);
                      anon_unknown_52::merge
                                (__return_storage_ptr__,
                                 (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  *)&p,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                        *)&p_1);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 *)&p_1);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 *)&p);
                      lVar2 = 0x18;
                      do {
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                   ((long)&p_2.
                                           super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + lVar2));
                        lVar2 = lVar2 + -0x10;
                      } while (lVar2 != -8);
                      this = &p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                      goto LAB_0018e7ae;
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&p_8.
                                super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    std::dynamic_pointer_cast<mocker::nasm::Ret,mocker::nasm::Inst>
                              ((shared_ptr<mocker::nasm::Inst> *)&p);
                    if (p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        == (element_type *)0x0) {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&p.
                                  super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                    ,0x5a,
                                    "std::vector<std::shared_ptr<Register>> mocker::nasm::getUsedRegs(const std::shared_ptr<Inst> &)"
                                   );
                    }
                    p_Var1 = &rbp()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *
                                 )&p_2,p_Var1);
                    p_Var1 = &rbx()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_a8,p_Var1);
                    p_Var1 = &r12()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_98,p_Var1);
                    p_Var1 = &r13()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_88,p_Var1);
                    p_Var1 = &r14()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_78,p_Var1);
                    p_Var1 = &r15()->
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    ;
                    std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr(&local_68,p_Var1);
                    __l_04._M_len = 6;
                    __l_04._M_array = (iterator)&p_2;
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::vector(__return_storage_ptr__,__l_04,(allocator_type *)&p_1);
                    lVar2 = 0x58;
                    do {
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                 ((long)&p_2.
                                         super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + lVar2));
                      lVar2 = lVar2 + -0x10;
                    } while (lVar2 != -8);
                    goto LAB_0018e62a;
                  }
                  getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   *)&p_2,&(p_1.
                                            super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->dest);
                  getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   *)&p,&(p_1.
                                          super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->operand);
                  anon_unknown_52::merge
                            (__return_storage_ptr__,
                             (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              *)&p_2,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                      *)&p);
                  goto LAB_0018e809;
                }
                p_Var1 = &rbp()->
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
                std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&p,
                           p_Var1);
                __l_02._M_len = 1;
                __l_02._M_array = (iterator)&p;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_02,(allocator_type *)&p_1);
              }
              else {
                std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&p,
                           &((p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->dest).
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>);
                __l_01._M_len = 1;
                __l_01._M_array = (iterator)&p;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_01,(allocator_type *)&p_1);
              }
            }
            else {
              std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&p,
                         (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                         &((p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->dest).
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&p;
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&p_1);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            getInvolvedRegs(__return_storage_ptr__,
                            &(p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->addr);
          }
          this = &p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
        else {
          std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&p_2,
                     &((p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->operand).
                      super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
          getInvolvedRegs(__return_storage_ptr__,(shared_ptr<mocker::nasm::Addr> *)&p_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&p,
                     &((p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->dest).super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                    ((shared_ptr<mocker::nasm::Addr> *)&p_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)&p_8,
                       &((p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->dest).
                        super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
            getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)&p,(shared_ptr<mocker::nasm::Addr> *)&p_8);
            anon_unknown_52::merge
                      ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        *)&p_2,__return_storage_ptr__,
                       (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        *)&p);
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::_M_move_assign(__return_storage_ptr__,
                             (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              *)&p_2);
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       *)&p_2);
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       *)&p);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_8.super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
LAB_0018e721:
          this = &p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        }
LAB_0018e7ae:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
        return __return_storage_ptr__;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0018e4a2:
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getUsedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Pop>(inst) || dyc<Jmp>(inst) || dyc<Cqo>(inst) ||
      dyc<CJump>(inst) || dyc<Set>(inst))
    return {};

  if (auto p = dyc<Call>(inst)) {
    return {rdi(), rsi(), rdx(), rcx(), r8(), r9()};
  }

  if (auto p = dyc<Mov>(inst)) {
    auto res = getInvolvedRegs(p->getOperand());
    if (!dyc<Register>(p->getDest()))
      res = merge(res, getInvolvedRegs(p->getDest()));
    return res;
  }

  if (auto p = dyc<Lea>(inst)) {
    return getInvolvedRegs(p->getAddr());
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Push>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rbp()};
  }
  if (auto p = dyc<Cmp>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return merge({rax(), rdx()}, getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Ret>(inst)) {
    return {rbp(), rbx(), r12(), r13(), r14(), r15()};
  }
  assert(false);
}